

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::base::UnixTaskRunner::UnixTaskRunner(UnixTaskRunner *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  (this->super_TaskRunner)._vptr_TaskRunner = (_func_int **)&PTR__UnixTaskRunner_003c6a30;
  ThreadChecker::ThreadChecker(&this->thread_checker_);
  lVar2 = syscall(0xba);
  this->created_thread_id_ = (PlatformThreadId)lVar2;
  EventFd::EventFd(&this->event_);
  memset(&this->poll_fds_,0,0x90);
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->immediate_tasks_).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  p_Var1 = &(this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->quit_ = false;
  p_Var1 = &(this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->watch_tasks_changed_ = false;
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:8207:39)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:8207:39)>
             ::_M_manager;
  (*(this->super_TaskRunner)._vptr_TaskRunner[4])(this,(ulong)(uint)(this->event_).event_handle_.t_)
  ;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

UnixTaskRunner::UnixTaskRunner() {
  AddFileDescriptorWatch(event_.fd(), [] {
    // Not reached -- see PostFileDescriptorWatches().
    PERFETTO_DFATAL("Should be unreachable.");
  });
}